

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O0

void * __thiscall cnn::SharedAllocator::malloc(SharedAllocator *this,size_t __size)

{
  ostream *this_00;
  void *this_01;
  out_of_memory *this_02;
  void *ptr;
  string *in_stack_ffffffffffffff98;
  allocator local_39;
  string local_38 [32];
  void *local_18;
  size_t local_10;
  SharedAllocator *local_8;
  
  local_10 = __size;
  local_8 = this;
  local_18 = mmap((void *)0x0,__size,3,0x21,-1,0);
  if (local_18 == (void *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"Shared memory allocation failed n=");
    this_01 = (void *)std::ostream::operator<<(this_00,local_10);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_02 = (out_of_memory *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Shared memory allocation failed",&local_39);
    out_of_memory::out_of_memory(this_02,in_stack_ffffffffffffff98);
    __cxa_throw(this_02,&out_of_memory::typeinfo,out_of_memory::~out_of_memory);
  }
  return local_18;
}

Assistant:

void* SharedAllocator::malloc(size_t n) {
  void* ptr = mmap(NULL, n, PROT_READ|PROT_WRITE, MAP_ANON|MAP_SHARED, -1, 0);
  if (!ptr) {
    cerr << "Shared memory allocation failed n=" << n << endl;
    throw cnn::out_of_memory("Shared memory allocation failed");
  }
  return ptr;
}